

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCompositeDeepScanLine.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_8bd70::data<float>::writeData(data<float> *this,DeepScanLineOutputPart *part)

{
  int iVar1;
  pointer pvVar2;
  pointer pvVar3;
  pointer pvVar4;
  pointer pfVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  Header *this_00;
  Box2i *pBVar9;
  long lVar10;
  ostream *poVar11;
  int iVar12;
  pointer *ppvVar13;
  ulong uVar14;
  int iVar15;
  long lVar16;
  size_t sVar17;
  undefined1 xtc;
  ulong uVar18;
  long lVar19;
  long *plVar20;
  ulong uVar21;
  int iVar22;
  long lVar23;
  pointer pbVar24;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  sample_buffers;
  vector<unsigned_int,_std::allocator<unsigned_int>_> counts;
  vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
  sample_pointers;
  DeepFrameBuffer fb;
  Slice local_68;
  
  this_00 = Imf_2_5::DeepScanLineOutputPart::header(part);
  pBVar9 = Imf_2_5::Header::dataWindow(this_00);
  iVar15 = (pBVar9->min).x;
  iVar1 = (pBVar9->min).y;
  iVar12 = (pBVar9->max).x;
  iVar8 = (pBVar9->max).y;
  bVar6 = iVar12 < iVar15;
  iVar22 = iVar8 - iVar1;
  bVar7 = iVar8 < iVar1;
  uVar21 = 1;
  if (!bVar7 && !bVar6) {
    uVar21 = (long)((iVar22 + 1) * ((iVar12 - iVar15) + 1));
  }
  pvVar2 = (this->_results).
           super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pvVar3 = (this->_samples).
           super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar4 = (this->_results).
           super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar19 = 0;
  lVar10 = (long)(this->_samples).
                 super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3;
  if (lVar10 != 0) {
    lVar10 = (lVar10 >> 3) * -0x5555555555555555;
    lVar10 = lVar10 + (ulong)(lVar10 == 0);
    ppvVar13 = (pointer *)
               ((long)&(pvVar3->
                       super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                       )._M_impl.super__Vector_impl_data + 8);
    lVar19 = 0;
    do {
      lVar19 = lVar19 + ((long)*ppvVar13 - (long)((_Vector_impl_data *)(ppvVar13 + -1))->_M_start >>
                        3) * -0x5555555555555555;
      ppvVar13 = ppvVar13 + 3;
      lVar10 = lVar10 + -1;
    } while (lVar10 != 0);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&counts,uVar21,(allocator_type *)&fb);
  std::
  vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
  ::vector(&sample_pointers,
           (long)(this->_channels).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->_channels).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 5,(allocator_type *)&fb);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::vector(&sample_buffers,
           (long)(this->_channels).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->_channels).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 5,(allocator_type *)&fb);
  if (sample_buffers.
      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      sample_buffers.
      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar10 = 0;
    uVar14 = 0;
    do {
      std::vector<float_*,_std::allocator<float_*>_>::resize
                ((vector<float_*,_std::allocator<float_*>_> *)
                 ((long)&((sample_pointers.
                           super__Vector_base<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<float_*,_std::allocator<float_*>_>)._M_impl.
                         super__Vector_impl_data._M_start + lVar10),uVar21);
      std::vector<float,_std::allocator<float>_>::resize
                ((vector<float,_std::allocator<float>_> *)
                 ((long)&((sample_buffers.
                           super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                         super__Vector_impl_data._M_start + lVar10),
                 lVar19 * (uVar21 / (ulong)(((long)pvVar2 - (long)pvVar4 >> 3) * -0x5555555555555555
                                           ) + 1));
      uVar14 = uVar14 + 1;
      lVar10 = lVar10 + 0x18;
    } while (uVar14 < (ulong)(((long)sample_buffers.
                                     super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)sample_buffers.
                                     super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) *
                             -0x5555555555555555));
  }
  if (uVar21 != 0) {
    uVar14 = 0;
    lVar19 = 0;
    lVar10 = 0;
    do {
      pvVar3 = (this->_samples).
               super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pvVar2 = pvVar3[lVar10].
               super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pvVar4 = *(pointer *)
                ((long)&pvVar3[lVar10].
                        super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                        ._M_impl.super__Vector_impl_data + 8);
      lVar16 = ((long)pvVar4 - (long)pvVar2 >> 3) * -0x5555555555555555;
      counts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar14] = (uint)lVar16;
      if (pvVar4 != pvVar2) {
        if ((this->_channels).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            (this->_channels).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          uVar18 = 0;
          do {
            if (pvVar4 != pvVar2) {
              plVar20 = *(long **)&(this->_samples).
                                   super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[lVar10].
                                   super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                   ._M_impl.super__Vector_impl_data;
              pfVar5 = sample_buffers.
                       super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar18].
                       super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start;
              lVar23 = 0;
              do {
                pfVar5[lVar19 + lVar23] = *(float *)(*plVar20 + uVar18 * 4);
                lVar23 = lVar23 + 1;
                plVar20 = plVar20 + 3;
              } while (lVar16 + (ulong)(lVar16 == 0) != lVar23);
            }
            sample_pointers.
            super__Vector_base<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar18].
            super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar14] =
                 sample_buffers.
                 super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar18].
                 super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
                 _M_start + lVar19;
            uVar18 = uVar18 + 1;
          } while (uVar18 < (ulong)((long)(this->_channels).
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(this->_channels).
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 5));
        }
        lVar19 = lVar19 + lVar16;
      }
      lVar10 = lVar10 + 1;
      if (lVar10 == ((long)(this->_samples).
                           super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->_samples).
                           super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555) {
        lVar10 = 0;
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 != uVar21);
  }
  xtc = 0xab;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," wrote ",7);
  poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11," samples  into ",0xf);
  poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11," pixels\n",8);
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  Imf_2_5::Slice::Slice
            (&fb._sampleCounts,HALF,(char *)0x0,0,0,1,1,0.0,(bool)xtc,
             SUB81(fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left,0));
  iVar8 = (iVar12 - iVar15) + 1;
  sVar17 = (long)iVar8 * 4;
  if (bVar7 || bVar6) {
    iVar8 = 1;
    sVar17 = 4;
  }
  Imf_2_5::Slice::Slice
            (&local_68,UINT,
             (char *)(counts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                      .super__Vector_impl_data._M_start + (-(long)iVar15 - (long)(iVar8 * iVar1))),4
             ,sVar17,1,1,0.0,(bool)xtc,(bool)((char)(iVar8 * iVar1) * '\x04'));
  Imf_2_5::DeepFrameBuffer::insertSampleCountSlice(&fb,&local_68);
  pbVar24 = (this->_channels).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_channels).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pbVar24) {
    iVar12 = (iVar12 - iVar15) + 1;
    sVar17 = (long)iVar12 * 8;
    if (bVar7 || bVar6) {
      iVar12 = 1;
      sVar17 = 8;
    }
    lVar19 = 0;
    lVar10 = 0;
    uVar21 = 0;
    do {
      Imf_2_5::DeepSlice::DeepSlice
                ((DeepSlice *)&local_68,this->_type,
                 (char *)(*(long *)((long)&((sample_pointers.
                                             super__Vector_base<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->
                                           super__Vector_base<float_*,_std::allocator<float_*>_>).
                                           _M_impl.super__Vector_impl_data._M_start + lVar19) +
                          (long)iVar15 * -8 + (long)(iVar12 * iVar1) * -8),8,sVar17,4,1,1,0.0,false,
                 false);
      Imf_2_5::DeepFrameBuffer::insert
                (&fb,(string *)((long)&(pbVar24->_M_dataplus)._M_p + lVar10),(DeepSlice *)&local_68)
      ;
      uVar21 = uVar21 + 1;
      pbVar24 = (this->_channels).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar10 = lVar10 + 0x20;
      lVar19 = lVar19 + 0x18;
    } while (uVar21 < (ulong)((long)(this->_channels).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar24 >> 5)
            );
  }
  Imf_2_5::DeepScanLineOutputPart::setFrameBuffer(part,&fb);
  iVar15 = 1;
  if (!bVar7 && !bVar6) {
    iVar15 = iVar22 + 1;
  }
  Imf_2_5::DeepScanLineOutputPart::writePixels(part,iVar15);
  std::
  _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>_>
               *)&fb);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector(&sample_buffers);
  std::
  vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
  ::~vector(&sample_pointers);
  if (counts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(counts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)counts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)counts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void 
    writeData(DeepScanLineOutputPart & part) const
    {
        Box2i dw=part.header().dataWindow();
        size_t output_pixels = (dw.size().x+1)*(dw.size().y+1);
        
        // how many times we'll write the same pattern
        size_t repeats = 1+(output_pixels/_results.size());
        
        size_t sample_buffer_size = totalSamples()*repeats;
        
        // buffer for sample counts
        vector<unsigned int> counts(output_pixels);
        
        // buffers for sample pointers
        vector< vector<T *> > sample_pointers(_channels.size());
        
        // buffer for actual sample data
        vector< vector<T> > sample_buffers(_channels.size());
        
        for(size_t i=0;i<sample_buffers.size();i++)
        {
            sample_pointers[i].resize(output_pixels);
            sample_buffers[i].resize(sample_buffer_size);
        }
        
        
        size_t pixel=0; // which pixel we are currently writing
        size_t sample=0; // which sample we are currently writing into
        
        for(size_t p=0;p<output_pixels;p++)
        {
            size_t count = _samples[pixel].size();
            counts[p]=count;
            if( count>0 )
            {
                for(size_t c=0 ; c<_channels.size() ; c++)
                {
                    for(size_t s=0 ; s < count ; s++ )
                    {
                        sample_buffers[c][sample+s]=_samples[pixel][s][c];
                    }
                    sample_pointers[c][p]=&sample_buffers[c][sample];
                }
                sample+=count;
            }
            pixel++;
            if(pixel==_samples.size()) pixel=0;
        }
        cout << " wrote " << sample << " samples  into " << output_pixels << " pixels\n";
        
        DeepFrameBuffer fb;
        fb.insertSampleCountSlice(Slice(UINT,
                                        (char *)(&counts[0]-dw.min.x-(dw.size().x+1)*dw.min.y),
                                        sizeof(unsigned int),
                                        sizeof(unsigned int)*(dw.size().x+1)
                                        )
                                  );
        for(size_t c=0;c<_channels.size();c++)
        {
            fb.insert(_channels[c],
                      DeepSlice(_type,(char *)(&sample_pointers[c][0]-dw.min.x-(dw.size().x+1)*dw.min.y),
                            sizeof(T *),
                            sizeof(T *)*(dw.size().x+1),
                            sizeof(T)
                            )
                     );
        }
        part.setFrameBuffer(fb);
        part.writePixels(dw.size().y+1);
        
    }